

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_0::MergingIterator::FindSmallest(MergingIterator *this)

{
  Comparator *pCVar1;
  int iVar2;
  IteratorWrapper *this_00;
  IteratorWrapper *this_01;
  long lVar3;
  int i;
  long lVar4;
  Slice local_50;
  Slice local_40;
  
  lVar3 = 0;
  this_00 = (IteratorWrapper *)0x0;
  for (lVar4 = 0; lVar4 < this->n_; lVar4 = lVar4 + 1) {
    this_01 = this_00;
    if (((&this->children_->valid_)[lVar3] == true) &&
       (this_01 = (IteratorWrapper *)((long)&this->children_->iter_ + lVar3),
       this_00 != (IteratorWrapper *)0x0)) {
      pCVar1 = this->comparator_;
      local_40 = IteratorWrapper::key(this_01);
      local_50 = IteratorWrapper::key(this_00);
      iVar2 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&local_40,&local_50);
      if (-1 < iVar2) {
        this_01 = this_00;
      }
    }
    lVar3 = lVar3 + 0x20;
    this_00 = this_01;
  }
  this->current_ = this_00;
  return;
}

Assistant:

void MergingIterator::FindSmallest() {
  IteratorWrapper* smallest = nullptr;
  for (int i = 0; i < n_; i++) {
    IteratorWrapper* child = &children_[i];
    if (child->Valid()) {
      if (smallest == nullptr) {
        smallest = child;
      } else if (comparator_->Compare(child->key(), smallest->key()) < 0) {
        smallest = child;
      }
    }
  }
  current_ = smallest;
}